

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this,Monom *m)

{
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> cont;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_50;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_30;
  
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom(&local_30,m);
  cont._M_len = 1;
  cont._M_array = &local_30;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack(&local_50,cont)
  ;
  Polynom(this,&local_50);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::~Stack(&local_50);
  IntegerConstantType::~IntegerConstantType(&local_30.numeral);
  return;
}

Assistant:

Polynom<Number>::Polynom(Monom m) 
  : Polynom(
      Stack<Monom>{m})
{  }